

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Naming.hpp
# Opt level: O2

string * HRRVarName(string *__return_storage_ptr__,string *brastr,int am3,int am4)

{
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"HRR",&local_49);
  ArrVarName(__return_storage_ptr__,brastr,am3,am4,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

inline std::string HRRVarName(const std::string & brastr, int am3, int am4)
{
    return ArrVarName(brastr, am3, am4, "HRR");
}